

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Datetime.cpp
# Opt level: O2

bool Datetime::valid(int y,int m,int d,int hr,int mi,int se)

{
  bool bVar1;
  int iVar2;
  
  if (((uint)se < 0x3c && ((uint)mi < 0x3c && (uint)hr < 0x19)) &&
     (hr != 0x18 || se == 0 && mi == 0)) {
    bVar1 = false;
    if ((0 < d) && ((bVar1 = false, -1 < y && (0xfffffff3 < m - 0xdU)))) {
      iVar2 = daysInMonth(y,m);
      bVar1 = d <= iVar2;
    }
    return bVar1;
  }
  return false;
}

Assistant:

bool Datetime::valid (
  const int y, const int m, const int d,
  const int hr, const int mi, const int se)
{
  if (hr < 0 || hr > 24)
    return false;

  if (mi < 0 || mi > 59)
    return false;

  if (se < 0 || se > 59)
    return false;

  if (hr == 24 &&
      (mi != 0 ||
       se != 0))
    return false;

  return Datetime::valid (y, m, d);
}